

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<char_const*,char_const*,Hasher,google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
::find_position<char_const*>
          (sparse_hashtable<char_const*,char_const*,Hasher,google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           *this,char **key)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  const_reference b;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  
  lVar1 = *(long *)(this + 0x88);
  pcVar3 = *key;
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  cVar4 = *pcVar3;
  if (cVar4 == '\0') {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      pcVar3 = pcVar3 + 1;
      uVar7 = (long)cVar4 + uVar7 * 0x21;
      cVar4 = *pcVar3;
    } while (cVar4 != '\0');
    uVar7 = uVar7 >> 3;
  }
  uVar9 = 0xffffffffffffffff;
  lVar8 = 0;
  do {
    uVar7 = uVar7 & lVar1 - 1U;
    uVar5 = (int)uVar7 + (int)(uVar7 / 0x30) * -0x30;
    if ((*(byte *)((ulong)(uVar5 >> 3) + 0x20 + (uVar7 / 0x30) * 0x28 + *(long *)(this + 0x60)) >>
         (uVar5 & 7) & 1) == 0) {
      uVar6 = uVar7;
      if (uVar9 != 0xffffffffffffffff) {
        uVar6 = uVar9;
      }
      uVar7 = 0xffffffffffffffff;
LAB_0064918e:
      pVar10.second = uVar6;
      pVar10.first = uVar7;
      return pVar10;
    }
    bVar2 = sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            ::test_deleted((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this,uVar7);
    if (bVar2) {
      if (uVar9 == 0xffffffffffffffff) {
        uVar9 = uVar7;
      }
    }
    else {
      b = sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::unsafe_get((sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                        *)(this + 0x50),uVar7);
      bVar2 = KeyInfo::equals<char_const*,char_const*>((KeyInfo *)(this + 0x30),key,b);
      if (bVar2) {
        uVar6 = 0xffffffffffffffff;
        goto LAB_0064918e;
      }
    }
    uVar7 = uVar7 + lVar8 + 1;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }